

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logic_program.cpp
# Opt level: O2

LogicProgram * __thiscall Clasp::Asp::LogicProgram::addRule(LogicProgram *this,Rule *rule)

{
  undefined1 *puVar1;
  RuleBuilder *out;
  int *piVar2;
  int iVar3;
  uint uVar4;
  bool bVar5;
  Impl *this_00;
  LogicProgram *this_01;
  uint *__v;
  long lVar6;
  RuleTransform tm;
  SRule meta;
  Rule sRule;
  
  if ((this->super_ProgramBuilder).frozen_ != true) {
    meta.hash = 0;
    meta.pos = 0;
    meta.bid = 0x40000000;
    out = &this->rule_;
    bVar5 = simplifyRule(this,rule,out,&meta);
    if (bVar5) {
      Potassco::RuleBuilder::rule(&sRule,out);
      piVar2 = (int *)(&(this->super_ProgramBuilder).field_0x1c +
                      (ulong)sRule.ht.val_ * 4 + (long)this->statsId_ * 0x14);
      *piVar2 = *piVar2 + 1;
      this_01 = this;
      bVar5 = handleNatively(this,&sRule);
      if (bVar5) {
        addRule(this,&sRule,&meta);
      }
      else {
        *(int *)(&this->field_0x44 + (ulong)sRule.bt.val_ * 4 + (long)this->statsId_ * 0xc) =
             *(int *)(&this->field_0x44 + (ulong)sRule.bt.val_ * 4 + (long)this->statsId_ * 0xc) + 1
        ;
        if ((sRule.head.size < 2) && (bVar5 = transformNoAux(this_01,&sRule), bVar5)) {
          iVar3 = this->statsId_;
          this->statsId_ = 1;
          RuleTransform::RuleTransform(&tm,this);
          *(int *)(&this->field_0x44 + (ulong)sRule.bt.val_ * 4 + (long)this->statsId_ * 0xc) =
               *(int *)(&this->field_0x44 + (ulong)sRule.bt.val_ * 4 + (long)this->statsId_ * 0xc) +
               -1;
          piVar2 = (int *)(&(this->super_ProgramBuilder).field_0x1c +
                          (ulong)(rule->ht).val_ * 4 + (long)this->statsId_ * 0x14);
          *piVar2 = *piVar2 + -1;
          RuleTransform::transform(&tm,&sRule,strategy_no_aux);
          this->statsId_ = iVar3;
          RuleTransform::~RuleTransform(&tm);
        }
        else {
          for (lVar6 = 0; sRule.head.size * 4 != lVar6; lVar6 = lVar6 + 4) {
            resize(this,*(Atom_t *)((long)sRule.head.first + lVar6));
          }
          this_00 = (Impl *)operator_new(0x10);
          Potassco::RuleBuilder::RuleBuilder((RuleBuilder *)this_00,out);
          tm.impl_ = this_00;
          bk_lib::pod_vector<Potassco::RuleBuilder_*,_std::allocator<Potassco::RuleBuilder_*>_>::
          push_back(&this->extended_,(RuleBuilder **)&tm);
        }
      }
    }
    if (this->statsId_ == 0) {
      __v = (rule->head).first;
      for (lVar6 = (rule->head).size << 2; lVar6 != 0; lVar6 = lVar6 + -4) {
        uVar4 = *__v;
        if ((this->input_).lo <= uVar4) {
          if (uVar4 < (this->atoms_).ebo_.size) {
            puVar1 = &((this->atoms_).ebo_.buf[uVar4]->super_PrgHead).field_0x18;
            *(uint *)puVar1 = *(uint *)puVar1 | 0x8000000;
          }
          else {
            std::__detail::
            _Insert_base<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
            ::insert((_Insert_base<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                      *)&this->auxData_->skippedHeads,__v);
          }
        }
        __v = __v + 1;
      }
    }
    Potassco::RuleBuilder::clear(out);
    return this;
  }
  Potassco::fail(-2,"LogicProgram &Clasp::Asp::LogicProgram::addRule(const Rule &)",0x312,
                 "!frozen()","Can\'t update frozen program!",0);
}

Assistant:

LogicProgram& LogicProgram::addRule(const Rule& rule) {
	check_not_frozen();
	SRule meta;
	if (simplifyRule(rule, rule_, meta)) {
		Rule sRule = rule_.rule();
		upStat(sRule.ht);
		if (handleNatively(sRule)) { // and can be handled natively
			addRule(sRule, meta);
		}
		else {
			upStat(sRule.bt);
			if (Potassco::size(sRule.head) <= 1 && transformNoAux(sRule)) {
				// rule transformation does not require aux atoms - do it now
				int oId  = statsId_;
				statsId_ = 1;
				RuleTransform tm(*this);
				upStat(sRule.bt, -1);
				upStat(rule.ht, -1);
				tm.transform(sRule, RuleTransform::strategy_no_aux);
				statsId_ = oId;
			}
			else {
				// make sure we have all head atoms
				for (Potassco::AtomSpan::iterator it = Potassco::begin(sRule.head), end = Potassco::end(sRule.head); it != end; ++it) {
					resize(*it);
				}
				extended_.push_back(new RuleBuilder(rule_));
			}
		}
	}
	if (statsId_ == 0) {
		// Assume all (new) heads are initially in "upper" closure.
		for (Potassco::AtomSpan::iterator it = Potassco::begin(rule.head), end = Potassco::end(rule.head); it != end; ++it) {
			if (!isNew(*it)) continue;
			if (validAtom(*it))
				getAtom(*it)->setInUpper(true);
			else
				auxData_->skippedHeads.insert(*it);
		}
	}
	rule_.clear();
	return *this;
}